

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void TPZSkylMatrix<long_double>::InitializeElem
               (TPZVec<long> *skyline,TPZVec<long_double> *storage,TPZVec<long_double_*> *point)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int64_t dim;
  longdouble local_38;
  
  lVar2 = skyline->fNElements;
  if (lVar2 < 1) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar4 = lVar5;
      plVar1 = skyline->fStore + lVar3;
      lVar5 = lVar4 + lVar3;
      lVar3 = lVar3 + 1;
      lVar5 = (lVar5 + 1) - *plVar1;
    } while (lVar2 != lVar3);
    lVar3 = (lVar4 - *plVar1) + lVar3;
  }
  (*storage->_vptr_TPZVec[3])(storage,lVar3);
  local_38 = (longdouble)0;
  TPZVec<long_double>::Fill(storage,&local_38,0,-1);
  (*point->_vptr_TPZVec[3])(point,lVar2 + 1);
  if (lVar2 == 0) {
    *point->fStore = (longdouble *)0x0;
  }
  else {
    *point->fStore = storage->fStore;
    point->fStore[lVar2] = storage->fStore + lVar3;
  }
  if (0 < lVar2) {
    lVar3 = 0x10;
    lVar5 = 0;
    do {
      point->fStore[lVar5 + 1] =
           (longdouble *)((long)point->fStore[lVar5] + lVar3 + skyline->fStore[lVar5] * -0x10);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar2 != lVar5);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::InitializeElem(const TPZVec<int64_t> &skyline, TPZVec<TVar> &storage, TPZVec<TVar *> &point) {   // JORGE 2013 OUTUBRO ???
	int64_t dim = skyline.NElements();
	int64_t nel = NumElements(skyline);
#ifdef PZDEBUG
    //	std::cout << "Skyline Matrix, Number of elements : " << nel << " in floating point " << nel*sizeof(TVar) << std::endl;
#endif
	storage.Resize(nel);
	storage.Fill(0.);
	int64_t i;
	point.Resize(dim+1);
	if(dim) {
		point[0] = &storage[0];
		point[dim] = &storage[0]+nel;
	} else {
		point[0] = 0;
	}
	for(i=1; i<dim+1; i++)
		point[i] = point[i-1]+(i-1)-skyline[i-1]+1;
}